

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::CleanUpInlineCaches<true>(FunctionBody *this)

{
  InlineCache *pIVar1;
  IsInstInlineCache *this_00;
  FunctionCodeGenRuntimeData *pFVar2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  uint32 uVar6;
  void *pvVar7;
  undefined4 *puVar8;
  FunctionBodyPolymorphicInlineCache *this_01;
  ulong uVar9;
  anon_class_16_2_3f4a2e36 fn;
  anon_class_16_2_3f4a2e36 fn_00;
  FunctionCodeGenRuntimeData *local_40;
  Type runtimeData;
  uint unregisteredInlineCacheCount;
  
  runtimeData.ptr._4_4_ = 0;
  if ((this->inlineCaches).ptr != (void **)0x0) {
    uVar5 = GetCountField(this,RootObjectLoadInlineCacheStart);
    if (uVar5 == 0) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      do {
        pIVar1 = (InlineCache *)(this->inlineCaches).ptr[uVar9];
        if (pIVar1 != (InlineCache *)0x0) {
          InlineCache::Clear(pIVar1);
        }
        uVar9 = uVar9 + 1;
      } while (uVar5 != uVar9);
    }
    GetRootObject(this);
    uVar5 = GetCountField(this,RootObjectLoadMethodInlineCacheStart);
    if ((uint)uVar9 < uVar5) {
      uVar9 = uVar9 & 0xffffffff;
      do {
        pIVar1 = (InlineCache *)(this->inlineCaches).ptr[uVar9];
        if (pIVar1 != (InlineCache *)0x0) {
          InlineCache::Clear(pIVar1);
        }
        uVar9 = uVar9 + 1;
      } while (uVar5 != uVar9);
    }
    uVar5 = GetCountField(this,RootObjectStoreInlineCacheStart);
    if ((uint)uVar9 < uVar5) {
      uVar9 = uVar9 & 0xffffffff;
      do {
        pIVar1 = (InlineCache *)(this->inlineCaches).ptr[uVar9];
        if (pIVar1 != (InlineCache *)0x0) {
          InlineCache::Clear(pIVar1);
        }
        uVar9 = uVar9 + 1;
      } while (uVar5 != uVar9);
    }
    uVar5 = GetCountField(this,InlineCacheCount);
    if ((uint)uVar9 < uVar5) {
      uVar9 = uVar9 & 0xffffffff;
      do {
        pIVar1 = (InlineCache *)(this->inlineCaches).ptr[uVar9];
        if (pIVar1 != (InlineCache *)0x0) {
          InlineCache::Clear(pIVar1);
        }
        uVar9 = uVar9 + 1;
      } while (uVar5 != uVar9);
    }
    uVar5 = GetCountField(this,InlineCacheCount);
    uVar6 = GetCountField(this,IsInstInlineCacheCount);
    if ((uint)uVar9 < uVar6 + uVar5) {
      uVar9 = uVar9 & 0xffffffff;
      do {
        this_00 = (IsInstInlineCache *)(this->inlineCaches).ptr[uVar9];
        if (this_00 != (IsInstInlineCache *)0x0) {
          IsInstInlineCache::Clear(this_00);
        }
        uVar9 = uVar9 + 1;
      } while (uVar6 + uVar5 != uVar9);
    }
    (this->inlineCaches).ptr = (void **)0x0;
  }
  pvVar7 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,CodeGenRuntimeData);
  if ((pvVar7 != (void *)0x0) && (this->profiledCallSiteCount != 0)) {
    uVar9 = 0;
    do {
      pFVar2 = *(FunctionCodeGenRuntimeData **)((long)pvVar7 + uVar9 * 8);
      if (pFVar2 != (FunctionCodeGenRuntimeData *)0x0) {
        fn.this = this;
        fn.unregisteredInlineCacheCount = (uint *)((long)&runtimeData.ptr + 4);
        FunctionCodeGenRuntimeData::
        MapInlineCaches<Js::FunctionBody::CleanUpInlineCaches<true>()::_lambda(Js::InlineCache*)_1_>
                  (pFVar2,fn);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < this->profiledCallSiteCount);
  }
  pvVar7 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,CodeGenGetSetRuntimeData);
  if ((pvVar7 != (void *)0x0) && (uVar5 = GetCountField(this,InlineCacheCount), uVar5 != 0)) {
    uVar9 = 0;
    do {
      pFVar2 = *(FunctionCodeGenRuntimeData **)((long)pvVar7 + uVar9 * 8);
      Memory::Recycler::WBSetBit((char *)&local_40);
      local_40 = pFVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_40);
      if (local_40 != (FunctionCodeGenRuntimeData *)0x0) {
        fn_00.this = this;
        fn_00.unregisteredInlineCacheCount = (uint *)((long)&runtimeData.ptr + 4);
        FunctionCodeGenRuntimeData::
        MapInlineCaches<Js::FunctionBody::CleanUpInlineCaches<true>()::_lambda(Js::InlineCache*)_2_>
                  (local_40,fn_00);
      }
      uVar9 = uVar9 + 1;
      uVar5 = GetCountField(this,InlineCacheCount);
    } while (uVar9 < uVar5);
  }
  if (runtimeData.ptr._4_4_ != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1db7,"(!IsScriptContextShutdown)",
                                "Unregistration of inlineCache should only be done if this is not scriptContext shutdown."
                               );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
    ThreadContext::NotifyInlineCacheBatchUnregistered
              (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
               threadContext,runtimeData.ptr._4_4_);
  }
  while (pvVar7 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,PolymorphicInlineCachesHead),
        pvVar7 != (void *)0x0) {
    this_01 = (FunctionBodyPolymorphicInlineCache *)
              FunctionProxy::GetAuxPtr((FunctionProxy *)this,PolymorphicInlineCachesHead);
    FunctionBodyPolymorphicInlineCache::Finalize(this_01,true);
  }
  (this->polymorphicInlineCaches).inlineCaches.ptr =
       (WriteBarrierPtr<Js::PolymorphicInlineCache> *)0x0;
  (this->polymorphicInlineCaches).inlineCacheCount = 0;
  return;
}

Assistant:

void FunctionBody::CleanUpInlineCaches()
    {
        uint unregisteredInlineCacheCount = 0;

        if (nullptr != this->inlineCaches)
        {
            // Inline caches are in this order
            //      plain inline cache
            //      root object load inline cache
            //      root object store inline cache
            //      isInst inline cache
            // The inlineCacheCount includes all but isInst inline cache

            uint i = 0;
            uint plainInlineCacheEnd = GetRootObjectLoadInlineCacheStart();
            for (; i < plainInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    InlineCache* inlineCache = (InlineCache*)this->inlineCaches[i];
                    if (IsScriptContextShutdown)
                    {
                        inlineCache->Clear();
                    }
                    else
                    {
                        if (inlineCache->RemoveFromInvalidationList())
                        {
                            unregisteredInlineCacheCount++;
                        }
                        AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                    }
                }
            }

            RootObjectBase * rootObjectBase = this->GetRootObject();
            uint rootObjectLoadInlineCacheEnd = GetRootObjectLoadMethodInlineCacheStart();
            for (; i < rootObjectLoadInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), false, false, IsScriptContextShutdown);
                    }
                }
            }

            uint rootObjectLoadMethodInlineCacheEnd = GetRootObjectStoreInlineCacheStart();
            for (; i < rootObjectLoadMethodInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), true, false, IsScriptContextShutdown);
                    }
                }
            }

            uint rootObjectStoreInlineCacheEnd = this->GetInlineCacheCount();
            for (; i < rootObjectStoreInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), false, true, IsScriptContextShutdown);
                    }
                }
            }

            uint totalCacheCount = GetInlineCacheCount() + GetIsInstInlineCacheCount();
            for (; i < totalCacheCount; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    IsInstInlineCache* inlineCache = (IsInstInlineCache*)this->inlineCaches[i];
                    if (IsScriptContextShutdown)
                    {
                        inlineCache->Clear();
                    }
                    else
                    {
                        inlineCache->Unregister(this->m_scriptContext);
                        AllocatorDelete(CacheAllocator, this->m_scriptContext->GetIsInstInlineCacheAllocator(), inlineCache);
                    }
                }
            }

            this->inlineCaches = nullptr;

        }

        auto codeGenRuntimeData = this->GetCodeGenRuntimeData();
        if (nullptr != codeGenRuntimeData)
        {
            for (ProfileId i = 0; i < this->profiledCallSiteCount; i++)
            {
                const FunctionCodeGenRuntimeData* runtimeData = codeGenRuntimeData[i];
                if (nullptr != runtimeData)
                {
                    runtimeData->MapInlineCaches([&](InlineCache* inlineCache)
                    {
                        if (nullptr != inlineCache)
                        {
                            if (IsScriptContextShutdown)
                            {
                                inlineCache->Clear();
                            }
                            else
                            {
                                if (inlineCache->RemoveFromInvalidationList())
                                {
                                    unregisteredInlineCacheCount++;
                                }
                                AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                            }
                        }
                    });
                }
            }
        }

        auto codeGenGetSetRuntimeData = this->GetCodeGenGetSetRuntimeData();
        if (codeGenGetSetRuntimeData != nullptr)
        {
            for (uint i = 0; i < this->GetInlineCacheCount(); i++)
            {
                auto runtimeData = codeGenGetSetRuntimeData[i];
                if (nullptr != runtimeData)
                {
                    runtimeData->MapInlineCaches([&](InlineCache* inlineCache)
                    {
                        if (nullptr != inlineCache)
                        {
                            if (IsScriptContextShutdown)
                            {
                                inlineCache->Clear();
                            }
                            else
                            {
                                if (inlineCache->RemoveFromInvalidationList())
                                {
                                    unregisteredInlineCacheCount++;
                                }
                                AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                            }
                        }
                    });
                }
            }
        }

        if (unregisteredInlineCacheCount > 0)
        {
            AssertMsg(!IsScriptContextShutdown, "Unregistration of inlineCache should only be done if this is not scriptContext shutdown.");
            ThreadContext* threadContext = this->m_scriptContext->GetThreadContext();
            threadContext->NotifyInlineCacheBatchUnregistered(unregisteredInlineCacheCount);
        }

        while (this->GetPolymorphicInlineCachesHead())
        {
            this->GetPolymorphicInlineCachesHead()->Finalize(IsScriptContextShutdown);
        }
        polymorphicInlineCaches.Reset();
    }